

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
          (basic_appender<char> out,write_int_arg<unsigned_int> arg,format_specs *specs)

{
  presentation_type pVar1;
  bool bVar2;
  basic_appender<char> bVar3;
  format_specs *specs_00;
  basic_specs *in_RDX;
  basic_appender<char> in_RSI;
  buffer<char> *in_RDI;
  uint padding;
  size_padding sp;
  uint p;
  basic_appender<char> it;
  int num_digits;
  long num_digits_1;
  uint prefix;
  uint abs_value;
  char *end;
  char *begin;
  char buffer [32];
  int buffer_size;
  undefined7 in_stack_fffffffffffffec8;
  char in_stack_fffffffffffffecf;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 in_stack_fffffffffffffed8;
  char in_stack_fffffffffffffed9;
  undefined1 in_stack_fffffffffffffeda;
  char in_stack_fffffffffffffedb;
  uint in_stack_fffffffffffffedc;
  basic_appender<char> local_a0;
  uint local_94;
  buffer<char> *local_90;
  basic_appender<char> local_88;
  int local_7c;
  buffer<char> *local_78;
  long local_70;
  bool local_61;
  uint local_60;
  uint local_5c;
  undefined1 *local_58;
  char *local_50;
  char local_48 [32];
  undefined1 local_28 [4];
  undefined4 local_24;
  basic_specs *local_20;
  uint local_18;
  uint uStack_14;
  basic_appender<char> local_10;
  buffer<char> *local_8;
  
  local_24 = 0x20;
  local_50 = (char *)0x0;
  local_58 = local_28;
  local_18 = (uint)in_RSI.container;
  local_5c = local_18;
  uStack_14 = (uint)((ulong)in_RSI.container >> 0x20);
  local_60 = uStack_14;
  local_20 = in_RDX;
  local_10.container = in_RDI;
  pVar1 = basic_specs::type(in_RDX);
  specs_00 = (format_specs *)(ulong)pVar1;
  switch(specs_00) {
  default:
    local_61 = false;
    ignore_unused<bool,char[1]>(&local_61,(char (*) [1])0x76292c);
  case (format_specs *)0x0:
  case (format_specs *)0x3:
    local_50 = do_format_decimal<char,unsigned_int>
                         ((char *)in_RDI,(uint)((ulong)in_RSI.container >> 0x20),
                          (int)in_RSI.container);
    break;
  case (format_specs *)0x4:
    in_stack_fffffffffffffedc = local_5c;
    bVar2 = basic_specs::upper(local_20);
    local_50 = do_format_base2e<char,unsigned_int>(4,local_48,in_stack_fffffffffffffedc,0x20,bVar2);
    bVar2 = basic_specs::alt(local_20);
    if (bVar2) {
      bVar2 = basic_specs::upper(local_20);
      in_stack_fffffffffffffeda = 0x78;
      in_stack_fffffffffffffedb = 'X';
      if (!bVar2) {
        in_stack_fffffffffffffedb = 'x';
      }
      prefix_append(&local_60,(int)in_stack_fffffffffffffedb << 8 | 0x30);
    }
    break;
  case (format_specs *)0x5:
    local_50 = do_format_base2e<char,unsigned_int>(3,local_48,local_5c,0x20,false);
    local_70 = (long)local_58 - (long)local_50;
    bVar2 = basic_specs::alt(local_20);
    if (((bVar2) && (*(int *)local_20[1].fill_data_ <= local_70)) && (local_5c != 0)) {
      prefix_append(&local_60,0x30);
    }
    break;
  case (format_specs *)0x6:
    local_50 = do_format_base2e<char,unsigned_int>(1,local_48,local_5c,0x20,false);
    bVar2 = basic_specs::alt(local_20);
    if (bVar2) {
      bVar2 = basic_specs::upper(local_20);
      in_stack_fffffffffffffed8 = 0x62;
      in_stack_fffffffffffffed9 = 'B';
      if (!bVar2) {
        in_stack_fffffffffffffed9 = 'b';
      }
      prefix_append(&local_60,(int)in_stack_fffffffffffffed9 << 8 | 0x30);
    }
    break;
  case (format_specs *)0x7:
    local_78 = local_10.container;
    bVar3 = write_char<char,fmt::v11::basic_appender<char>>
                      (in_RSI,'\0',
                       (format_specs *)
                       CONCAT44(in_stack_fffffffffffffedc,
                                CONCAT13(in_stack_fffffffffffffedb,
                                         CONCAT12(in_stack_fffffffffffffeda,
                                                  CONCAT11(in_stack_fffffffffffffed9,
                                                           in_stack_fffffffffffffed8)))));
    return (basic_appender<char>)bVar3.container;
  }
  local_7c = (int)local_58 - (int)local_50;
  if (local_20[1].data_ == 0 && *(int *)local_20[1].fill_data_ == -1) {
    local_90 = local_10.container;
    to_unsigned<int>(0);
    local_88 = reserve<char>(in_RSI,(size_t)specs_00);
    for (local_94 = local_60 & 0xffffff; local_94 != 0; local_94 = local_94 >> 8) {
      in_stack_fffffffffffffed7 = (undefined1)local_94;
      local_a0 = basic_appender<char>::operator++(&local_88,0);
      basic_appender<char>::operator*(&local_a0);
      basic_appender<char>::operator=
                ((basic_appender<char> *)
                 CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecf);
    }
    bVar3.container._1_1_ = in_stack_fffffffffffffed9;
    bVar3.container._0_1_ = in_stack_fffffffffffffed8;
    bVar3.container._2_1_ = in_stack_fffffffffffffeda;
    bVar3.container._3_1_ = in_stack_fffffffffffffedb;
    bVar3.container._4_4_ = in_stack_fffffffffffffedc;
    bVar3 = copy<char,_const_char_*,_fmt::v11::basic_appender<char>,_0>
                      ((char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                       (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),bVar3);
    local_8 = (buffer<char> *)base_iterator<fmt::v11::basic_appender<char>>(local_10,bVar3);
  }
  else {
    size_padding::size_padding
              ((size_padding *)in_RDI,(int)((ulong)in_RSI.container >> 0x20),(uint)in_RSI.container,
               specs_00);
    local_8 = (buffer<char> *)
              write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned_int>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned_int>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                        (in_RSI,specs_00,
                         CONCAT44(in_stack_fffffffffffffedc,
                                  CONCAT13(in_stack_fffffffffffffedb,
                                           CONCAT12(in_stack_fffffffffffffeda,
                                                    CONCAT11(in_stack_fffffffffffffed9,
                                                             in_stack_fffffffffffffed8)))),
                         (anon_class_24_4_0fb5e8cf *)
                         CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(OutputIt out,
                                                   write_int_arg<T> arg,
                                                   const format_specs& specs)
    -> OutputIt {
  return write_int<Char>(out, arg, specs);
}